

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

NodeSet * __thiscall
capnp::compiler::NodeTranslator::getBootstrapNode
          (NodeSet *__return_storage_ptr__,NodeTranslator *this)

{
  AuxNode *pAVar1;
  NodeSet *pNVar2;
  Reader *pRVar3;
  Reader *pRVar4;
  Reader *pRVar5;
  AuxNode *group;
  AuxNode *pAVar6;
  size_t sVar7;
  ReaderFor<capnp::schema::Node> nodeReader;
  Reader *local_d8;
  StructReader local_c0;
  Reader *local_90;
  NodeSet *local_88;
  Reader *local_80;
  Reader *local_78;
  Reader *local_70;
  undefined8 *local_68;
  StructReader local_60;
  
  local_88 = __return_storage_ptr__;
  pRVar3 = (Reader *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x30,0,((long)(this->groups).builder.pos - (long)(this->groups).builder.ptr >>
                             6) + ((long)(this->paramStructs).builder.pos -
                                   (long)(this->paramStructs).builder.ptr >> 6) + 1,
                      (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  _::OrphanBuilder::asStructReader(&local_c0,&(this->sourceInfo).builder,(StructSize)0x20001);
  (pRVar3->_reader).dataSize = local_c0.dataSize;
  (pRVar3->_reader).pointerCount = local_c0.pointerCount;
  *(undefined2 *)&(pRVar3->_reader).field_0x26 = local_c0._38_2_;
  (pRVar3->_reader).nestingLimit = local_c0.nestingLimit;
  *(undefined4 *)&(pRVar3->_reader).field_0x2c = local_c0._44_4_;
  (pRVar3->_reader).data = local_c0.data;
  (pRVar3->_reader).pointers = local_c0.pointers;
  (pRVar3->_reader).segment = local_c0.segment;
  (pRVar3->_reader).capTable = local_c0.capTable;
  local_d8 = pRVar3 + 1;
  pAVar6 = (this->groups).builder.ptr;
  pAVar1 = (this->groups).builder.pos;
  if (pAVar6 != pAVar1) {
    do {
      _::OrphanBuilder::asStructReader(&local_c0,&(pAVar6->sourceInfo).builder,(StructSize)0x20001);
      (local_d8->_reader).dataSize = local_c0.dataSize;
      (local_d8->_reader).pointerCount = local_c0.pointerCount;
      *(undefined2 *)&(local_d8->_reader).field_0x26 = local_c0._38_2_;
      (local_d8->_reader).nestingLimit = local_c0.nestingLimit;
      *(undefined4 *)&(local_d8->_reader).field_0x2c = local_c0._44_4_;
      (local_d8->_reader).data = local_c0.data;
      (local_d8->_reader).pointers = local_c0.pointers;
      (local_d8->_reader).segment = local_c0.segment;
      (local_d8->_reader).capTable = local_c0.capTable;
      local_d8 = local_d8 + 1;
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar1);
  }
  pAVar6 = (this->paramStructs).builder.ptr;
  pAVar1 = (this->paramStructs).builder.pos;
  if (pAVar6 != pAVar1) {
    do {
      _::OrphanBuilder::asStructReader(&local_c0,&(pAVar6->sourceInfo).builder,(StructSize)0x20001);
      (local_d8->_reader).dataSize = local_c0.dataSize;
      (local_d8->_reader).pointerCount = local_c0.pointerCount;
      *(undefined2 *)&(local_d8->_reader).field_0x26 = local_c0._38_2_;
      (local_d8->_reader).nestingLimit = local_c0.nestingLimit;
      *(undefined4 *)&(local_d8->_reader).field_0x2c = local_c0._44_4_;
      (local_d8->_reader).data = local_c0.data;
      (local_d8->_reader).pointers = local_c0.pointers;
      (local_d8->_reader).segment = local_c0.segment;
      (local_d8->_reader).capTable = local_c0.capTable;
      local_d8 = local_d8 + 1;
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar1);
  }
  _::OrphanBuilder::asStructReader(&local_60,&(this->wipNode).builder,(StructSize)0x60005);
  pNVar2 = local_88;
  if ((local_60.dataSize < 0x70) || (*(short *)((long)local_60.data + 0xc) != 3)) {
    (local_88->node)._reader.dataSize = local_60.dataSize;
    (local_88->node)._reader.pointerCount = local_60.pointerCount;
    *(short *)&(local_88->node)._reader.field_0x26 = local_60._38_2_;
    (local_88->node)._reader.nestingLimit = local_60.nestingLimit;
    *(undefined4 *)&(local_88->node)._reader.field_0x2c = local_60._44_4_;
    (local_88->node)._reader.data = local_60.data;
    (local_88->node)._reader.pointers = local_60.pointers;
    (local_88->node)._reader.segment = local_60.segment;
    (local_88->node)._reader.capTable = local_60.capTable;
    sVar7 = (long)(this->groups).builder.pos - (long)(this->groups).builder.ptr >> 6;
    pRVar5 = (Reader *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x30,0,sVar7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_70 = pRVar5 + sVar7;
    local_68 = &kj::_::HeapArrayDisposer::instance;
    pAVar6 = (this->groups).builder.ptr;
    pRVar4 = pRVar5;
    if (pAVar6 != (this->groups).builder.pos) {
      local_80 = pRVar5;
      do {
        local_78 = pRVar4;
        _::OrphanBuilder::asStructReader(&local_c0,(OrphanBuilder *)pAVar6,(StructSize)0x60005);
        (pRVar4->_reader).dataSize = local_c0.dataSize;
        (pRVar4->_reader).pointerCount = local_c0.pointerCount;
        *(undefined2 *)&(pRVar4->_reader).field_0x26 = local_c0._38_2_;
        (pRVar4->_reader).nestingLimit = local_c0.nestingLimit;
        *(undefined4 *)&(pRVar4->_reader).field_0x2c = local_c0._44_4_;
        (pRVar4->_reader).data = local_c0.data;
        (pRVar4->_reader).pointers = local_c0.pointers;
        (pRVar4->_reader).segment = local_c0.segment;
        (pRVar4->_reader).capTable = local_c0.capTable;
        pRVar4 = pRVar4 + 1;
        pAVar6 = pAVar6 + 1;
      } while (pAVar6 != (this->groups).builder.pos);
    }
    (local_88->auxNodes).ptr = pRVar5;
    (local_88->auxNodes).size_ = ((long)pRVar4 - (long)pRVar5 >> 4) * -0x5555555555555555;
  }
  else {
    (local_88->node)._reader.dataSize = local_60.dataSize;
    (local_88->node)._reader.pointerCount = local_60.pointerCount;
    *(short *)&(local_88->node)._reader.field_0x26 = local_60._38_2_;
    (local_88->node)._reader.nestingLimit = local_60.nestingLimit;
    *(undefined4 *)&(local_88->node)._reader.field_0x2c = local_60._44_4_;
    (local_88->node)._reader.data = local_60.data;
    (local_88->node)._reader.pointers = local_60.pointers;
    (local_88->node)._reader.segment = local_60.segment;
    (local_88->node)._reader.capTable = local_60.capTable;
    sVar7 = (long)(this->paramStructs).builder.pos - (long)(this->paramStructs).builder.ptr >> 6;
    pRVar4 = (Reader *)
             kj::_::HeapArrayDisposer::allocateImpl
                       (0x30,0,sVar7,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_70 = pRVar4 + sVar7;
    local_68 = &kj::_::HeapArrayDisposer::instance;
    pAVar6 = (this->paramStructs).builder.ptr;
    local_90 = pRVar4;
    if (pAVar6 != (this->paramStructs).builder.pos) {
      local_80 = pRVar4;
      do {
        local_78 = pRVar4;
        _::OrphanBuilder::asStructReader(&local_c0,(OrphanBuilder *)pAVar6,(StructSize)0x60005);
        (pRVar4->_reader).dataSize = local_c0.dataSize;
        (pRVar4->_reader).pointerCount = local_c0.pointerCount;
        *(undefined2 *)&(pRVar4->_reader).field_0x26 = local_c0._38_2_;
        (pRVar4->_reader).nestingLimit = local_c0.nestingLimit;
        *(undefined4 *)&(pRVar4->_reader).field_0x2c = local_c0._44_4_;
        (pRVar4->_reader).data = local_c0.data;
        (pRVar4->_reader).pointers = local_c0.pointers;
        (pRVar4->_reader).segment = local_c0.segment;
        (pRVar4->_reader).capTable = local_c0.capTable;
        pRVar4 = pRVar4 + 1;
        pAVar6 = pAVar6 + 1;
      } while (pAVar6 != (this->paramStructs).builder.pos);
    }
    (pNVar2->auxNodes).ptr = local_90;
    (pNVar2->auxNodes).size_ = ((long)pRVar4 - (long)local_90 >> 4) * -0x5555555555555555;
    local_88 = pNVar2;
  }
  (local_88->auxNodes).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  (local_88->sourceInfo).ptr = pRVar3;
  (local_88->sourceInfo).size_ = ((long)local_d8 - (long)pRVar3 >> 4) * -0x5555555555555555;
  (local_88->sourceInfo).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return local_88;
}

Assistant:

NodeTranslator::NodeSet NodeTranslator::getBootstrapNode() {
  auto sourceInfos = kj::heapArrayBuilder<schema::Node::SourceInfo::Reader>(
      1 + groups.size() + paramStructs.size());
  sourceInfos.add(sourceInfo.getReader());
  for (auto& group: groups) {
    sourceInfos.add(group.sourceInfo.getReader());
  }
  for (auto& paramStruct: paramStructs) {
    sourceInfos.add(paramStruct.sourceInfo.getReader());
  }

  auto nodeReader = wipNode.getReader();
  if (nodeReader.isInterface()) {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, paramStructs) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  } else {
    return NodeSet {
      nodeReader,
      KJ_MAP(g, groups) { return g.node.getReader(); },
      sourceInfos.finish()
    };
  }
}